

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::DoThrow(Thread *this,Ptr *exn)

{
  uint uVar1;
  Store *store;
  CatchDesc CVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  Exception *pEVar6;
  Ref ref;
  DefinedFunc *this_00;
  FuncDesc *pFVar7;
  vector<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_> *this_01;
  reference pCVar8;
  RefVec *this_02;
  const_reference pvVar9;
  reference pHVar10;
  Tag *this_03;
  TagType *pTVar11;
  Values *values;
  value_type local_138;
  reference local_130;
  Frame *target_frame;
  int local_11c;
  size_t local_118;
  undefined1 local_110 [8];
  Ptr catch_tag;
  Ref catch_tag_ref;
  CatchDesc _catch;
  const_iterator __end5;
  const_iterator __begin5;
  vector<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_> *__range5;
  reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
  local_c8;
  reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
  local_c0;
  reference local_b8;
  HandlerDesc *handler;
  undefined1 local_a8 [8];
  reverse_iterator iter;
  vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_> handlers;
  u32 pc;
  undefined1 local_78 [8];
  Ptr func;
  Frame *frame;
  bool had_catch_all;
  bool popped_frame;
  undefined1 local_48 [8];
  Ptr exn_tag;
  u32 local_28;
  u32 target_exceptions;
  u32 target_values;
  Offset target_offset;
  Ptr *exn_local;
  Thread *this_local;
  
  target_exceptions = 0xffffffff;
  store = this->store_;
  pEVar6 = RefPtr<wabt::interp::Exception>::operator->(exn);
  ref = Exception::tag(pEVar6);
  RefPtr<wabt::interp::Tag>::RefPtr((RefPtr<wabt::interp::Tag> *)local_48,store,ref);
  bVar5 = false;
  bVar3 = false;
  do {
    bVar4 = std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::empty
                      (&this->frames_);
    if (((bVar4 ^ 0xffU) & 1) == 0) {
      bVar5 = std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::empty
                        (&this->frames_);
      if (!bVar5) {
        __assert_fail("frames_.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/interp.cc"
                      ,0xa4f,"RunResult wabt::interp::Thread::DoThrow(Exception::Ptr)");
      }
      this_local._4_4_ = Exception;
      local_11c = 1;
      goto LAB_001fd88e;
    }
    func.root_index_ =
         (Index)std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::back
                          (&this->frames_);
    RefPtr<wabt::interp::DefinedFunc>::RefPtr
              ((RefPtr<wabt::interp::DefinedFunc> *)local_78,this->store_,
               (Ref)(((reference)func.root_index_)->func).index);
    uVar1 = *(uint *)(func.root_index_ + 0x10);
    this_00 = RefPtr<wabt::interp::DefinedFunc>::operator->
                        ((RefPtr<wabt::interp::DefinedFunc> *)local_78);
    pFVar7 = DefinedFunc::desc(this_00);
    std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::vector
              ((vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_> *)
               &iter,&pFVar7->handlers);
    std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::rbegin
              ((vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_> *)
               local_a8);
    while( true ) {
      std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::rend
                ((vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_> *)
                 &handler);
      bVar4 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
                               *)local_a8,
                              (reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
                               *)&handler);
      if (!bVar4) break;
      local_b8 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
                              *)local_a8);
      if ((uVar1 < local_b8->try_start_offset) || (local_b8->try_end_offset <= uVar1)) {
LAB_001fd68c:
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
        ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
                      *)&target_frame,(int)local_a8);
      }
      else {
        if (local_b8->kind != Delegate) {
          this_01 = &local_b8->catches;
          __end5 = std::vector<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>::
                   begin(this_01);
          _catch = (CatchDesc)
                   std::vector<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>::
                   end(this_01);
          while (bVar4 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<const_wabt::interp::CatchDesc_*,_std::vector<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>_>
                                             *)&_catch), bVar4) {
            pCVar8 = __gnu_cxx::
                     __normal_iterator<const_wabt::interp::CatchDesc_*,_std::vector<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>_>
                     ::operator*(&__end5);
            CVar2 = *pCVar8;
            this_02 = Instance::tags(*(Instance **)(func.root_index_ + 0x18));
            pvVar9 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                               (this_02,(ulong)CVar2 & 0xffffffff);
            local_118 = pvVar9->index;
            catch_tag.root_index_ = local_118;
            RefPtr<wabt::interp::Tag>::RefPtr
                      ((RefPtr<wabt::interp::Tag> *)local_110,this->store_,(Ref)local_118);
            bVar4 = interp::operator==((RefPtr<wabt::interp::Tag> *)local_48,
                                       (RefPtr<wabt::interp::Tag> *)local_110);
            if (bVar4) {
              catch_tag_ref.index._4_4_ = CVar2.offset;
              target_exceptions = catch_tag_ref.index._4_4_;
              pHVar10 = std::
                        reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
                        ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
                                     *)local_a8);
              local_28 = pHVar10->values;
              pHVar10 = std::
                        reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
                        ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
                                     *)local_a8);
              exn_tag.root_index_._4_4_ = pHVar10->exceptions;
              local_11c = 8;
            }
            else {
              local_11c = 0;
            }
            RefPtr<wabt::interp::Tag>::~RefPtr((RefPtr<wabt::interp::Tag> *)local_110);
            if (local_11c != 0) goto LAB_001fd6c0;
            __gnu_cxx::
            __normal_iterator<const_wabt::interp::CatchDesc_*,_std::vector<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>_>
            ::operator++(&__end5);
          }
          if ((local_b8->field_4).catch_all_offset == 0xffffffff) goto LAB_001fd68c;
          target_exceptions = (local_b8->field_4).catch_all_offset;
          pHVar10 = std::
                    reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
                    ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
                                 *)local_a8);
          local_28 = pHVar10->values;
          pHVar10 = std::
                    reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
                    ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
                                 *)local_a8);
          exn_tag.root_index_._4_4_ = pHVar10->exceptions;
          bVar3 = true;
          local_11c = 8;
          goto LAB_001fd6c0;
        }
        std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::rend
                  ((vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_> *)
                   &__range5);
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
        ::operator-(&local_c8,(difference_type)&__range5);
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<wabt::interp::HandlerDesc_*,_std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>_>_>
        ::operator-(&local_c0,(difference_type)&local_c8);
      }
    }
    std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::pop_back(&this->frames_)
    ;
    bVar5 = true;
    local_11c = 0;
LAB_001fd6c0:
    std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::~vector
              ((vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_> *)
               &iter);
    RefPtr<wabt::interp::DefinedFunc>::~RefPtr((RefPtr<wabt::interp::DefinedFunc> *)local_78);
  } while (local_11c == 0);
  if (local_11c == 8) {
    if (target_exceptions == 0xffffffff) {
      __assert_fail("target_offset != Istream::kInvalidOffset",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/interp.cc"
                    ,0xa53,"RunResult wabt::interp::Thread::DoThrow(Exception::Ptr)");
    }
    local_130 = std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::back
                          (&this->frames_);
    if (bVar5) {
      this->inst_ = local_130->inst;
      this->mod_ = local_130->mod;
    }
    std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::resize
              (&this->values_,(ulong)(local_130->values + local_28));
    std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::resize
              (&this->exceptions_,(ulong)(local_130->exceptions + exn_tag.root_index_._4_4_));
    local_130->offset = target_exceptions;
    local_138.index = (size_t)RefPtr<wabt::interp::Exception>::ref(exn);
    std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
              (&this->exceptions_,&local_138);
    if (!bVar3) {
      this_03 = RefPtr<wabt::interp::Tag>::operator->((RefPtr<wabt::interp::Tag> *)local_48);
      pTVar11 = Tag::type(this_03);
      pEVar6 = RefPtr<wabt::interp::Exception>::operator->(exn);
      values = Exception::args(pEVar6);
      PushValues(this,&pTVar11->signature,values);
    }
    this_local._4_4_ = Ok;
    local_11c = 1;
  }
LAB_001fd88e:
  RefPtr<wabt::interp::Tag>::~RefPtr((RefPtr<wabt::interp::Tag> *)local_48);
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoThrow(Exception::Ptr exn) {
  Istream::Offset target_offset = Istream::kInvalidOffset;
  u32 target_values, target_exceptions;
  Tag::Ptr exn_tag{store_, exn->tag()};
  bool popped_frame = false;
  bool had_catch_all = false;

  // DoThrow is responsible for unwinding the stack at the point at which an
  // exception is thrown, and also branching to the appropriate catch within
  // the target try-catch. In a compiler, the tag dispatch might be done in
  // generated code in a landing pad, but this is easier for the interpreter.
  while (!frames_.empty()) {
    const Frame& frame = frames_.back();
    DefinedFunc::Ptr func{store_, frame.func};
    u32 pc = frame.offset;
    auto handlers = func->desc().handlers;

    // We iterate in reverse order, in order to traverse handlers from most
    // specific (pushed last) to least specific within a nested stack of
    // try-catch blocks.
    auto iter = handlers.rbegin();
    while (iter != handlers.rend()) {
      const HandlerDesc& handler = *iter;
      if (pc >= handler.try_start_offset && pc < handler.try_end_offset) {
        // For a try-delegate, skip part of the traversal by directly going
        // up to an outer handler specified by the delegate depth.
        if (handler.kind == HandlerKind::Delegate) {
          // Subtract one as we're trying to get a reverse iterator that is
          // offset by `delegate_handler_index` from the first item.
          iter = handlers.rend() - handler.delegate_handler_index - 1;
          continue;
        }
        // Otherwise, check for a matching catch tag or catch_all.
        for (auto _catch : handler.catches) {
          // Here we have to be careful to use the target frame's instance
          // to look up the tag rather than the throw's instance.
          Ref catch_tag_ref = frame.inst->tags()[_catch.tag_index];
          Tag::Ptr catch_tag{store_, catch_tag_ref};
          if (exn_tag == catch_tag) {
            target_offset = _catch.offset;
            target_values = (*iter).values;
            target_exceptions = (*iter).exceptions;
            goto found_handler;
          }
        }
        if (handler.catch_all_offset != Istream::kInvalidOffset) {
          target_offset = handler.catch_all_offset;
          target_values = (*iter).values;
          target_exceptions = (*iter).exceptions;
          had_catch_all = true;
          goto found_handler;
        }
      }
      iter++;
    }
    frames_.pop_back();
    popped_frame = true;
  }

  // If the call frames are empty now, the exception is uncaught.
  assert(frames_.empty());
  return RunResult::Exception;

found_handler:
  assert(target_offset != Istream::kInvalidOffset);

  Frame& target_frame = frames_.back();
  // If the throw crosses call frames, we need to reset the state to that
  // call frame's values. The stack heights may need to be offset by the
  // handler's heights as we may be jumping into the middle of the function
  // code after some stack height changes.
  if (popped_frame) {
    inst_ = target_frame.inst;
    mod_ = target_frame.mod;
  }
  values_.resize(target_frame.values + target_values);
  exceptions_.resize(target_frame.exceptions + target_exceptions);
  // Jump to the handler.
  target_frame.offset = target_offset;
  // When an exception is caught, it needs to be tracked in a stack
  // to allow for rethrows. This stack is popped on leaving the try-catch
  // or by control instructions such as `br`.
  exceptions_.push_back(exn.ref());
  // Also push exception payload values if applicable.
  if (!had_catch_all) {
    PushValues(exn_tag->type().signature, exn->args());
  }
  return RunResult::Ok;
}